

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AggregateMarking.cpp
# Opt level: O0

bool __thiscall DIS::AggregateMarking::operator==(AggregateMarking *this,AggregateMarking *rhs)

{
  byte local_1a;
  bool local_19;
  uchar idx;
  bool ivarsEqual;
  AggregateMarking *rhs_local;
  AggregateMarking *this_local;
  
  local_19 = this->_characterSet == rhs->_characterSet;
  for (local_1a = 0; local_1a < 0x1f; local_1a = local_1a + 1) {
    if (this->_characters[local_1a] != rhs->_characters[local_1a]) {
      local_19 = false;
    }
  }
  return local_19;
}

Assistant:

bool AggregateMarking::operator ==(const AggregateMarking& rhs) const
 {
     bool ivarsEqual = true;

     if( ! (_characterSet == rhs._characterSet) ) ivarsEqual = false;

     for(unsigned char idx = 0; idx < 31; idx++)
     {
          if(!(_characters[idx] == rhs._characters[idx]) ) ivarsEqual = false;
     }


    return ivarsEqual;
 }